

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

int64_t __thiscall indk::NeuralNet::doFindEntry(NeuralNet *this,string *ename)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  long *__s2;
  int iVar4;
  long lVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  int64_t iVar9;
  pointer ppVar10;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  pointer local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  pointer local_38;
  
  ppVar6 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar10 = (this->Entries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = local_48;
  pcVar1 = (ename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + ename->_M_string_length);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_58,local_50 + (long)local_58);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_78,local_70 + (long)local_78);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_c0,local_b8 + (long)local_c0);
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_98,local_90 + (long)local_98);
  sVar3 = local_b8;
  __s2 = local_c0;
  lVar5 = ((long)ppVar10 - (long)ppVar6 >> 3) * 0x6db6db6db6db6db7 >> 2;
  ppVar7 = ppVar6;
  local_a0 = ppVar10;
  if (0 < lVar5) {
    local_38 = ppVar6 + lVar5 * 4;
    lVar5 = lVar5 + 1;
    ppVar10 = ppVar6 + 2;
    do {
      sVar2 = ppVar10[-2].first._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          ppVar8 = ppVar10 + -2;
          goto LAB_001167f6;
        }
        iVar4 = bcmp(ppVar10[-2].first._M_dataplus._M_p,__s2,sVar2);
        ppVar8 = ppVar6;
        if (iVar4 == 0) goto LAB_001167f6;
      }
      sVar2 = ppVar10[-1].first._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          ppVar8 = ppVar6 + 1;
          goto LAB_001167f6;
        }
        iVar4 = bcmp(ppVar10[-1].first._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          ppVar8 = ppVar10 + -1;
          goto LAB_001167f6;
        }
      }
      sVar2 = (ppVar10->first)._M_string_length;
      if (sVar2 == sVar3) {
        ppVar8 = ppVar10;
        if (sVar2 == 0) goto LAB_001167f6;
        iVar4 = bcmp((ppVar10->first)._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          ppVar8 = ppVar6 + 2;
          goto LAB_001167f6;
        }
      }
      sVar2 = ppVar10[1].first._M_string_length;
      if (sVar2 == sVar3) {
        if (sVar2 == 0) {
          ppVar8 = ppVar6 + 3;
          goto LAB_001167f6;
        }
        iVar4 = bcmp(ppVar10[1].first._M_dataplus._M_p,__s2,sVar2);
        if (iVar4 == 0) {
          ppVar8 = ppVar10 + 1;
          goto LAB_001167f6;
        }
      }
      ppVar6 = ppVar6 + 4;
      lVar5 = lVar5 + -1;
      ppVar10 = ppVar10 + 4;
      ppVar7 = local_38;
    } while (1 < lVar5);
  }
  lVar5 = ((long)local_a0 - (long)ppVar7 >> 3) * 0x6db6db6db6db6db7;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppVar8 = local_a0;
      if ((lVar5 != 3) ||
         ((sVar3 = (ppVar7->first)._M_string_length, sVar3 == local_b8 &&
          ((ppVar8 = ppVar7, sVar3 == 0 ||
           (iVar4 = bcmp((ppVar7->first)._M_dataplus._M_p,local_c0,sVar3), iVar4 == 0))))))
      goto LAB_001167f6;
      ppVar7 = ppVar7 + 1;
    }
    sVar3 = (ppVar7->first)._M_string_length;
    if ((sVar3 == local_b8) &&
       ((ppVar8 = ppVar7, sVar3 == 0 ||
        (iVar4 = bcmp((ppVar7->first)._M_dataplus._M_p,local_c0,sVar3), iVar4 == 0))))
    goto LAB_001167f6;
    ppVar7 = ppVar7 + 1;
  }
  sVar3 = (ppVar7->first)._M_string_length;
  ppVar8 = local_a0;
  if (((sVar3 == local_b8) && (ppVar8 = ppVar7, sVar3 != 0)) &&
     (iVar4 = bcmp((ppVar7->first)._M_dataplus._M_p,local_c0,sVar3), iVar4 != 0)) {
    ppVar8 = local_a0;
  }
LAB_001167f6:
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (ppVar8 == (this->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar9 = -1;
  }
  else {
    iVar9 = ((long)ppVar8 -
             (long)(this->Entries).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  }
  return iVar9;
}

Assistant:

int64_t indk::NeuralNet::doFindEntry(const std::string& ename) {
    auto ne = std::find_if(Entries.begin(), Entries.end(), [ename](const std::pair<std::string, std::vector<std::string>>& e){
        return e.first == ename;
    });
    if (ne == Entries.end()) return -1;
    return std::distance(Entries.begin(), ne);
}